

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  long *plVar1;
  size_type *psVar2;
  long *local_60 [2];
  long local_50 [2];
  size_type *local_40;
  string msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,self->ob_type->tp_name,
             (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
  plVar1 = (long *)std::__cxx11::string::append((char *)local_60);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar2) {
    msg._M_string_length = *psVar2;
    msg.field_2._M_allocated_capacity = plVar1[3];
    local_40 = &msg._M_string_length;
  }
  else {
    msg._M_string_length = *psVar2;
    local_40 = (size_type *)*plVar1;
  }
  msg._M_dataplus._M_p = (pointer)plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  PyErr_SetString(_PyExc_TypeError,local_40);
  if (local_40 != &msg._M_string_length) {
    operator_delete(local_40,msg._M_string_length + 1);
  }
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg = get_fully_qualified_tp_name(type) + ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}